

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

void duckdb_re2::PatchList::Patch(Inst *inst0,PatchList l,uint32_t p)

{
  ulong uVar1;
  
  while (l.head != 0) {
    uVar1 = (ulong)l >> 1 & 0x7fffffff;
    if (((ulong)l & 1) == 0) {
      l.head = inst0[uVar1].out_opcode_ >> 4;
      l.tail = 0;
      inst0[uVar1].out_opcode_ = inst0[uVar1].out_opcode_ & 0xf | p << 4;
    }
    else {
      l.tail = 0;
      l.head = inst0[uVar1].field_1.out1_;
      inst0[uVar1].field_1.out1_ = p;
    }
  }
  return;
}

Assistant:

static void Patch(Prog::Inst* inst0, PatchList l, uint32_t p) {
    while (l.head != 0) {
      Prog::Inst* ip = &inst0[l.head>>1];
      if (l.head&1) {
        l.head = ip->out1();
        ip->out1_ = p;
      } else {
        l.head = ip->out();
        ip->set_out(p);
      }
    }
  }